

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.c
# Opt level: O1

_Bool Curl_pipeline_server_blacklisted(Curl_easy *handle,char *server_name)

{
  int iVar1;
  curl_llist *pcVar2;
  curl_llist_element *pcVar3;
  size_t max;
  blacklist_node *bl;
  
  if (server_name != (char *)0x0 && handle->multi != (Curl_multi *)0x0) {
    pcVar2 = Curl_multi_pipelining_server_bl(handle->multi);
    for (pcVar3 = pcVar2->head; pcVar3 != (curl_llist_element *)0x0; pcVar3 = pcVar3->next) {
      max = strlen((char *)(pcVar3 + 1));
      iVar1 = Curl_strncasecompare((char *)(pcVar3 + 1),server_name,max);
      if (iVar1 != 0) {
        Curl_infof(handle,"Server %s is blacklisted\n",server_name);
        if (pcVar3 == (curl_llist_element *)0x0) {
          return false;
        }
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool Curl_pipeline_server_blacklisted(struct Curl_easy *handle,
                                      char *server_name)
{
  if(handle->multi && server_name) {
    struct curl_llist *list =
      Curl_multi_pipelining_server_bl(handle->multi);

    struct curl_llist_element *e = list->head;
    while(e) {
      struct blacklist_node *bl = (struct blacklist_node *)e;
      if(strncasecompare(bl->server_name, server_name,
                         strlen(bl->server_name))) {
        infof(handle, "Server %s is blacklisted\n", server_name);
        return TRUE;
      }
      e = e->next;
    }

    DEBUGF(infof(handle, "Server %s is not blacklisted\n", server_name));
  }
  return FALSE;
}